

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O2

int ggml_backend_sched_backend_id_from_cur(ggml_backend_sched_t sched,ggml_tensor *tensor)

{
  _func__Bool_ggml_backend_buffer_type_t *p_Var1;
  ggml_backend_dev_t pgVar2;
  _func__Bool_ggml_backend_dev_t_ggml_tensor_ptr *p_Var3;
  ggml_backend_buffer_type_t pgVar4;
  _Bool _Var5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ggml_tensor *pgVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  
  iVar6 = ggml_backend_sched_backend_from_buffer(sched,tensor,tensor);
  if (iVar6 == -1) {
    if (tensor->view_src == (ggml_tensor *)0x0) {
      if (tensor->buffer != (ggml_backend_buffer *)0x0) {
        pgVar9 = (ggml_tensor *)0x0;
        goto LAB_0012d847;
      }
    }
    else {
      iVar6 = ggml_backend_sched_backend_from_buffer(sched,tensor->view_src,tensor);
      if (iVar6 != -1) {
        return iVar6;
      }
      pgVar9 = tensor->view_src;
      if ((tensor->buffer != (ggml_backend_buffer *)0x0) ||
         ((pgVar9 != (ggml_tensor *)0x0 && (pgVar9->buffer != (ggml_backend_buffer *)0x0)))) {
LAB_0012d847:
        if (pgVar9 == (ggml_tensor *)0x0) {
          pgVar9 = tensor;
        }
        pgVar4 = pgVar9->buffer->buft;
        pcVar10 = (*(pgVar4->iface).get_name)(pgVar4);
        pcVar11 = ggml_op_name(tensor->op);
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
                   ,0x2ec,
                   "pre-allocated tensor (%s) in a buffer (%s) that cannot run the operation (%s)",
                   tensor->name,pcVar10,pcVar11);
      }
    }
    if ((tensor->flags & 1) == 0) {
      iVar6 = -1;
      for (lVar8 = 0x13; lVar8 != 0x1d; lVar8 = lVar8 + 1) {
        pgVar9 = (ggml_tensor *)tensor->ne[lVar8 + -2];
        if ((((pgVar9 != (ggml_tensor *)0x0) && (tensor->op != GGML_OP_ROPE)) &&
            (pgVar9->buffer != (ggml_backend_buffer *)0x0)) &&
           (pgVar9->buffer->usage == GGML_BACKEND_BUFFER_USAGE_WEIGHTS)) {
          uVar7 = ggml_backend_sched_backend_from_buffer(sched,pgVar9,tensor);
          if (uVar7 != sched->n_backends - 1U) {
            return uVar7;
          }
          pgVar4 = pgVar9->buffer->buft;
          p_Var1 = (pgVar4->iface).is_host;
          if (p_Var1 == (_func__Bool_ggml_backend_buffer_type_t *)0x0) {
            return uVar7;
          }
          _Var5 = (*p_Var1)(pgVar4);
          if (!_Var5) {
            return uVar7;
          }
          uVar13 = 0;
          uVar12 = (ulong)uVar7;
          if ((int)uVar7 < 1) {
            uVar12 = uVar13;
          }
          do {
            if (uVar12 == uVar13) {
              return uVar7;
            }
            pgVar2 = sched->backends[uVar13]->device;
            _Var5 = (*(pgVar2->iface).supports_op)(pgVar2,tensor);
            if (_Var5) {
              pgVar2 = sched->backends[uVar13]->device;
              p_Var3 = (pgVar2->iface).offload_op;
              if ((p_Var3 != (_func__Bool_ggml_backend_dev_t_ggml_tensor_ptr *)0x0) &&
                 (_Var5 = (*p_Var3)(pgVar2,tensor), _Var5)) {
                return (int)uVar13;
              }
            }
            uVar13 = uVar13 + 1;
          } while( true );
        }
      }
    }
    else {
      iVar6 = sched->n_backends + -1;
    }
  }
  return iVar6;
}

Assistant:

static int ggml_backend_sched_backend_id_from_cur(ggml_backend_sched_t sched, struct ggml_tensor * tensor) {
    // assign pre-allocated nodes to their backend
    int cur_backend_id = ggml_backend_sched_backend_from_buffer(sched, tensor, tensor);
    if (cur_backend_id != -1) {
        SET_CAUSE(tensor, "1.dst");
        return cur_backend_id;
    }

    // view_src
    if (tensor->view_src != NULL) {
        cur_backend_id = ggml_backend_sched_backend_from_buffer(sched, tensor->view_src, tensor);
        if (cur_backend_id != -1) {
            SET_CAUSE(tensor, "1.vsrc");
            return cur_backend_id;
        }
    }

    if (tensor->buffer || (tensor->view_src && tensor->view_src->buffer)) {
        // since the tensor is pre-allocated, it cannot be moved to another backend
        ggml_backend_buffer_t buffer = tensor->view_src ? tensor->view_src->buffer : tensor->buffer;
        GGML_ABORT("pre-allocated tensor (%s) in a buffer (%s) that cannot run the operation (%s)", tensor->name, ggml_backend_buffer_name(buffer), ggml_op_name(tensor->op));
    }

    // graph input
    if (tensor->flags & GGML_TENSOR_FLAG_INPUT) {
        cur_backend_id = sched->n_backends - 1; // last backend (assumed CPU)
        SET_CAUSE(tensor, "1.inp");
        return cur_backend_id;
    }

    // operations with weights are preferably run on the same backend as the weights
    for (int i = 0; i < GGML_MAX_SRC; i++) {
        const struct ggml_tensor * src = tensor->src[i];
        if (src == NULL) {
            continue;
        }
        // skip ROPE since the rope freqs tensor is too small to choose a backend based on it
        // not an ideal solution
        if (tensor->op != GGML_OP_ROPE && src->buffer != NULL && src->buffer->usage == GGML_BACKEND_BUFFER_USAGE_WEIGHTS) {
            int src_backend_id = ggml_backend_sched_backend_from_buffer(sched, src, tensor);
            // check if a backend with higher prio wants to offload the op
            if (src_backend_id == sched->n_backends - 1 && ggml_backend_buffer_is_host(src->buffer)) {
                for (int b = 0; b < src_backend_id; b++) {
                    if (ggml_backend_supports_op(sched->backends[b], tensor) && ggml_backend_offload_op(sched->backends[b], tensor)) {
                        SET_CAUSE(tensor, "1.off");
                        return b;
                    }
                }
            }
            SET_CAUSE(tensor, "1.wgt%d", i);
            return src_backend_id;
        }
    }

    return -1;
}